

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O3

void png_read_filter_row(png_structrp pp,png_row_infop row_info,png_bytep row,
                        png_const_bytep prev_row,int filter)

{
  byte bVar1;
  code *pcVar2;
  
  if (filter - 1U < 4) {
    if (pp->read_filter[0] == (_func_void_png_row_infop_png_bytep_png_const_bytep *)0x0) {
      bVar1 = pp->pixel_depth;
      pp->read_filter[0] = png_read_filter_row_sub;
      pp->read_filter[1] = png_read_filter_row_up;
      pp->read_filter[2] = png_read_filter_row_avg;
      pcVar2 = png_read_filter_row_paeth_multibyte_pixel;
      if ((bVar1 + 7 & 0xfffffff8) == 8) {
        pcVar2 = png_read_filter_row_paeth_1byte_pixel;
      }
      pp->read_filter[3] = pcVar2;
    }
    (*pp->read_filter[filter - 1U])(row_info,row,prev_row);
    return;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_read_filter_row(png_structrp pp, png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row, int filter)
{
   /* OPTIMIZATION: DO NOT MODIFY THIS FUNCTION, instead #define
    * PNG_FILTER_OPTIMIZATIONS to a function that overrides the generic
    * implementations.  See png_init_filter_functions above.
    */
   if (filter > PNG_FILTER_VALUE_NONE && filter < PNG_FILTER_VALUE_LAST)
   {
      if (pp->read_filter[0] == NULL)
         png_init_filter_functions(pp);

      pp->read_filter[filter-1](row_info, row, prev_row);
   }
}